

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::strings_internal::
Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
::operator()(ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
             *this,Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *splitter)

{
  const_iterator __position;
  undefined1 uVar1;
  bool bVar2;
  pointer this_00;
  raw_view *__last;
  reference pvVar3;
  pointer this_01;
  size_type sVar4;
  SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSVar5;
  SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSVar6;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  size_t index;
  const_iterator it;
  array<raw_view,_16UL> ar;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *v;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffe18;
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *in_stack_fffffffffffffe20;
  byte local_1b9;
  undefined7 in_stack_fffffffffffffe68;
  SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_02;
  SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_150;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_120 [10];
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x19db19);
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
  begin(in_stack_fffffffffffffe20);
  while (uVar1 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::at_end(&local_150), ((uVar1 ^ 0xff) & 1) != 0) {
    this_02 = (SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)0x0;
    do {
      this_00 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator->(&local_150);
      __last = (raw_view *)std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
      pvVar3 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)in_stack_fffffffffffffe20,
                          (size_type)in_stack_fffffffffffffe18);
      pvVar3->data = (char *)__last;
      this_01 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator->(&local_150);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_01);
      pvVar3 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)in_stack_fffffffffffffe20,
                          (size_type)in_stack_fffffffffffffe18);
      pvVar3->size = sVar4;
      SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator++(this_02);
      pSVar5 = (SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)((long)&this_02->pos_ + 1);
      this_02 = pSVar5;
      pSVar6 = (SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)std::
                  array<absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
                  ::operator()((array<absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
                                *)local_120);
      local_1b9 = 0;
      if (pSVar5 != pSVar6) {
        bVar2 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::at_end(&local_150);
        local_1b9 = bVar2 ^ 0xff;
      }
    } while ((local_1b9 & 1) != 0);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::end(in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
    ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
              ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)in_stack_fffffffffffffe20,
               (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = local_120;
    in_stack_fffffffffffffe20 =
         (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *)std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)0x19dc83);
    std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)0x19dc91);
    __position._M_current._7_1_ = uVar1;
    __position._M_current._0_7_ = in_stack_fffffffffffffe68;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::operator()((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this_00,__position,(raw_view *)this_01,__last);
  }
  return in_RDI;
}

Assistant:

std::vector<absl::string_view, A> operator()(
        const Splitter& splitter) const {
      struct raw_view {
        const char* data;
        size_t size;
        operator absl::string_view() const {  // NOLINT(runtime/explicit)
          return {data, size};
        }
      };
      std::vector<absl::string_view, A> v;
      std::array<raw_view, 16> ar;
      for (auto it = splitter.begin(); !it.at_end();) {
        size_t index = 0;
        do {
          ar[index].data = it->data();
          ar[index].size = it->size();
          ++it;
        } while (++index != ar.size() && !it.at_end());
        // We static_cast index to a signed type to work around overzealous
        // compiler warnings about signedness.
        v.insert(v.end(), ar.begin(),
                 ar.begin() + static_cast<ptrdiff_t>(index));
      }
      return v;
    }